

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
kj::Maybe<kj::(anonymous_namespace)::CopyOrMove>::Maybe<kj::(anonymous_namespace)::CopyOrMove>
          (Maybe<kj::(anonymous_namespace)::CopyOrMove> *this,
          Maybe<kj::(anonymous_namespace)::CopyOrMove_&> *other)

{
  Maybe<kj::(anonymous_namespace)::CopyOrMove_&> local_40;
  CopyOrMove *local_38;
  CopyOrMove *val;
  CopyOrMove *local_20;
  CopyOrMove *_val1458;
  Maybe<kj::(anonymous_namespace)::CopyOrMove_&> *other_local;
  Maybe<kj::(anonymous_namespace)::CopyOrMove> *this_local;
  
  _val1458 = (CopyOrMove *)other;
  other_local = (Maybe<kj::(anonymous_namespace)::CopyOrMove_&> *)this;
  kj::_::NullableValue<kj::(anonymous_namespace)::CopyOrMove>::NullableValue(&this->ptr);
  local_38 = kj::_::readMaybe<kj::(anonymous_namespace)::CopyOrMove>
                       ((Maybe<kj::(anonymous_namespace)::CopyOrMove_&> *)_val1458);
  if (local_38 != (CopyOrMove *)0x0) {
    local_20 = local_38;
    kj::_::NullableValue<kj::(anonymous_namespace)::CopyOrMove>::
    emplace<kj::(anonymous_namespace)::CopyOrMove&>(&this->ptr,local_38);
    Maybe<kj::(anonymous_namespace)::CopyOrMove_&>::Maybe(&local_40);
    Maybe<kj::(anonymous_namespace)::CopyOrMove_&>::operator=
              ((Maybe<kj::(anonymous_namespace)::CopyOrMove_&> *)_val1458,&local_40);
  }
  return;
}

Assistant:

Maybe(Maybe<U&>&& other) {
    KJ_IF_SOME(val, other) {
      ptr.emplace(val);
      other = kj::none;
    }
  }